

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

void __thiscall
icu_63::anon_unknown_20::RelDateFmtDataSink::put
          (RelDateFmtDataSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  int32_t local_64;
  int32_t offset;
  int32_t i;
  int32_t len;
  int32_t n;
  ResourceTable relDayTable;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  RelDateFmtDataSink *this_local;
  
  relDayTable._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&len,value,errorCode);
  i = 0;
  offset = 0;
  local_64 = 0;
  while( true ) {
    UVar1 = ResourceTable::getKeyAndValue
                      ((ResourceTable *)&len,local_64,(char **)&value_local,value);
    if (UVar1 == '\0') break;
    iVar2 = atoi((char *)value_local);
    i = iVar2 + 2;
    if ((i < this->fDatesLen) && (this->fDatesPtr[i].string == (UChar *)0x0)) {
      this->fDatesPtr[i].offset = iVar2;
      iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,&offset,relDayTable._32_8_);
      this->fDatesPtr[i].string = (UChar *)CONCAT44(extraout_var,iVar2);
      this->fDatesPtr[i].len = offset;
    }
    local_64 = local_64 + 1;
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value,
                   UBool /*noFallback*/, UErrorCode &errorCode) {
      ResourceTable relDayTable = value.getTable(errorCode);
      int32_t n = 0;
      int32_t len = 0;
      for (int32_t i = 0; relDayTable.getKeyAndValue(i, key, value); ++i) {
        // Find the relative offset.
        int32_t offset = atoi(key);

        // Put in the proper spot, but don't override existing data.
        n = offset + UDAT_DIRECTION_THIS; // Converts to index in UDAT_R
        if (n < fDatesLen && fDatesPtr[n].string == NULL) {
          // Not found and n is an empty slot.
          fDatesPtr[n].offset = offset;
          fDatesPtr[n].string = value.getString(len, errorCode);
          fDatesPtr[n].len = len;
        }
      }
  }